

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  void *var;
  Var fname;
  RecyclableObject *pRVar2;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  var = SnapObjectGetAddtlInfoAs<void*,(TTD::NSSnapObjects::SnapObjectType)6>(snpObject);
  if (var == (void *)0x0) {
    fname = (Var)0x0;
  }
  else {
    fname = InflateMap::InflateTTDVar(inflator,var);
  }
  pRVar2 = Js::JavascriptLibrary::CreateExternalFunction_TTD
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,fname);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapExternalFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            TTDVar snapVar = SnapObjectGetAddtlInfoAs<TTDVar, SnapObjectType::SnapExternalFunctionObject>(snpObject);

            Js::Var fname = (snapVar != nullptr) ? inflator->InflateTTDVar(snapVar) : nullptr;
            return ctx->GetLibrary()->CreateExternalFunction_TTD(fname);
        }